

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

int Cec_ManSimSimulateRound(Cec_ManSim_t *p,Vec_Ptr_t *vInfoCis,Vec_Ptr_t *vInfoCos)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  Gia_Obj_t *pObj_00;
  uint *puVar6;
  void *pvVar7;
  uint *puVar8;
  bool bVar9;
  float Mem;
  int local_58;
  int local_54;
  int iCoId;
  int iCiId;
  int Ent;
  int w;
  int k;
  int i;
  uint *pRes;
  uint *pRes1;
  uint *pRes0;
  Gia_Obj_t *pObj;
  Vec_Ptr_t *vInfoCos_local;
  Vec_Ptr_t *vInfoCis_local;
  Cec_ManSim_t *p_local;
  
  local_54 = 0;
  local_58 = 0;
  if (p->nWordsOld != p->nWords) {
    Cec_ManSimMemRelink(p);
  }
  p->nMemsMax = 0;
  if (p->pScores != (int *)0x0) {
    free(p->pScores);
    p->pScores = (int *)0x0;
  }
  if (p->pBestState != (Abc_Cex_t *)0x0) {
    piVar5 = (int *)calloc((long)(p->nWords << 5),4);
    p->pScores = piVar5;
  }
  Vec_IntClear(p->vRefinedC);
  pObj_00 = Gia_ManConst0(p->pAig);
  iVar2 = Gia_ObjValue(pObj_00);
  if (iVar2 != 0) {
    puVar6 = Cec_ManSimSimRef(p,0);
    for (iCiId = 1; iCiId <= p->nWords; iCiId = iCiId + 1) {
      puVar6[iCiId] = 0;
    }
  }
  w = 1;
  do {
    bVar9 = false;
    if (w < p->pAig->nObjs) {
      pRes0 = (uint *)Gia_ManObj(p->pAig,w);
      bVar9 = (Gia_Obj_t *)pRes0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) {
      if (p->pPars->fConstCorr != 0) {
        for (Ent = 0; iVar2 = Vec_IntSize(p->vRefinedC), Ent < iVar2; Ent = Ent + 1) {
          iVar2 = Vec_IntEntry(p->vRefinedC,Ent);
          Gia_ObjSetRepr(p->pAig,iVar2,0xfffffff);
          Cec_ManSimSimDeref(p,iVar2);
        }
        Vec_IntClear(p->vRefinedC);
      }
      iVar2 = Vec_IntSize(p->vRefinedC);
      if (0 < iVar2) {
        Cec_ManSimProcessRefined(p,p->vRefinedC);
      }
      if ((vInfoCis != (Vec_Ptr_t *)0x0) && (iVar2 = Gia_ManCiNum(p->pAig), local_54 != iVar2)) {
        __assert_fail("vInfoCis == NULL || iCiId == Gia_ManCiNum(p->pAig)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                      ,0x307,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      if ((vInfoCos != (Vec_Ptr_t *)0x0) && (iVar2 = Gia_ManCoNum(p->pAig), local_58 != iVar2)) {
        __assert_fail("vInfoCos == NULL || iCoId == Gia_ManCoNum(p->pAig)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                      ,0x308,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      if (p->nMems == 1) {
        if (p->nMems != 1) {
          Abc_Print(1,"Cec_ManSimSimulateRound(): Memory management error!\n");
        }
        if (p->pPars->fVeryVerbose != 0) {
          pGVar1 = p->pAig;
          Mem = Cec_MemUsage(p);
          Gia_ManEquivPrintClasses(pGVar1,0,Mem);
        }
        if (p->pBestState != (Abc_Cex_t *)0x0) {
          Cec_ManSimFindBestPattern(p);
        }
        iVar2 = Cec_ManSimAnalyzeOutputs(p);
        return iVar2;
      }
      __assert_fail("p->nMems == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                    ,0x309,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
    }
    iVar2 = Gia_ObjIsCi((Gia_Obj_t *)pRes0);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsCo((Gia_Obj_t *)pRes0);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjValue((Gia_Obj_t *)pRes0);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjValue(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                        ,0x2c9,
                        "int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
        }
        _k = Cec_ManSimSimRef(p,w);
        iVar2 = Gia_ObjFaninId0((Gia_Obj_t *)pRes0,w);
        puVar6 = Cec_ManSimSimDeref(p,iVar2);
        iVar2 = Gia_ObjFaninId1((Gia_Obj_t *)pRes0,w);
        puVar8 = Cec_ManSimSimDeref(p,iVar2);
        iVar2 = Gia_ObjFaninC0((Gia_Obj_t *)pRes0);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjFaninC1((Gia_Obj_t *)pRes0);
          if (iVar2 == 0) {
            for (iCiId = 1; iCiId <= p->nWords; iCiId = iCiId + 1) {
              _k[iCiId] = puVar6[iCiId] & puVar8[iCiId];
            }
          }
          else {
            for (iCiId = 1; iCiId <= p->nWords; iCiId = iCiId + 1) {
              _k[iCiId] = puVar6[iCiId] & (puVar8[iCiId] ^ 0xffffffff);
            }
          }
        }
        else {
          iVar2 = Gia_ObjFaninC1((Gia_Obj_t *)pRes0);
          if (iVar2 == 0) {
            for (iCiId = 1; iCiId <= p->nWords; iCiId = iCiId + 1) {
              _k[iCiId] = (puVar6[iCiId] ^ 0xffffffff) & puVar8[iCiId];
            }
          }
          else {
            for (iCiId = 1; iCiId <= p->nWords; iCiId = iCiId + 1) {
              _k[iCiId] = (puVar6[iCiId] | puVar8[iCiId]) ^ 0xffffffff;
            }
          }
        }
        goto LAB_0078c63f;
      }
      iVar2 = Gia_ObjFaninId0((Gia_Obj_t *)pRes0,w);
      puVar6 = Cec_ManSimSimDeref(p,iVar2);
      if (vInfoCos != (Vec_Ptr_t *)0x0) {
        iVar2 = local_58 + 1;
        pvVar7 = Vec_PtrEntry(vInfoCos,local_58);
        iVar4 = Gia_ObjFaninC0((Gia_Obj_t *)pRes0);
        local_58 = iVar2;
        if (iVar4 == 0) {
          for (iCiId = 1; iCiId <= p->nWords; iCiId = iCiId + 1) {
            *(uint *)((long)pvVar7 + (long)(iCiId + -1) * 4) = puVar6[iCiId];
          }
        }
        else {
          for (iCiId = 1; iCiId <= p->nWords; iCiId = iCiId + 1) {
            *(uint *)((long)pvVar7 + (long)(iCiId + -1) * 4) = puVar6[iCiId] ^ 0xffffffff;
          }
        }
      }
    }
    else {
      iVar2 = Gia_ObjValue((Gia_Obj_t *)pRes0);
      if (iVar2 == 0) {
        local_54 = local_54 + 1;
      }
      else {
        _k = Cec_ManSimSimRef(p,w);
        if (vInfoCis == (Vec_Ptr_t *)0x0) {
          for (iCiId = 1; iCiId <= p->nWords; iCiId = iCiId + 1) {
            uVar3 = Gia_ManRandom(0);
            _k[iCiId] = uVar3;
          }
        }
        else {
          iVar2 = local_54 + 1;
          pvVar7 = Vec_PtrEntry(vInfoCis,local_54);
          for (iCiId = 1; local_54 = iVar2, iCiId <= p->nWords; iCiId = iCiId + 1) {
            _k[iCiId] = *(uint *)((long)pvVar7 + (long)(iCiId + -1) * 4);
          }
        }
        _k[1] = _k[1] & 1 ^ _k[1];
LAB_0078c63f:
        iVar2 = Gia_ObjIsConst(p->pAig,w);
        if ((iVar2 != 0) && (iVar2 = Cec_ManSimCompareConst(_k + 1,p->nWords), iVar2 == 0)) {
          *_k = *_k + 1;
          Vec_IntPush(p->vRefinedC,w);
          if (p->pBestState != (Abc_Cex_t *)0x0) {
            Cec_ManSimCompareConstScore(_k + 1,p->nWords,p->pScores);
          }
        }
        iVar2 = Gia_ObjIsClass(p->pAig,w);
        if (iVar2 != 0) {
          *_k = *_k + 1;
        }
        iVar2 = Gia_ObjIsTail(p->pAig,w);
        if (iVar2 != 0) {
          Vec_IntClear(p->vClassTemp);
          pGVar1 = p->pAig;
          iVar2 = Gia_ObjRepr(p->pAig,w);
          iVar2 = Gia_ObjIsHead(pGVar1,iVar2);
          if (iVar2 == 0) {
            __assert_fail("Gia_ObjIsHead(p->pAig, Gia_ObjRepr(p->pAig, i))",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                          ,0x2f3,
                          "int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
          }
          for (iCoId = Gia_ObjRepr(p->pAig,w); iCoId != 0; iCoId = Gia_ObjNext(p->pAig,iCoId)) {
            Vec_IntPush(p->vClassTemp,iCoId);
          }
          iVar2 = Gia_ObjRepr(p->pAig,w);
          Cec_ManSimClassRefineOne(p,iVar2);
          for (Ent = 0; iVar2 = Vec_IntSize(p->vClassTemp), Ent < iVar2; Ent = Ent + 1) {
            iVar2 = Vec_IntEntry(p->vClassTemp,Ent);
            Cec_ManSimSimDeref(p,iVar2);
          }
        }
      }
    }
    w = w + 1;
  } while( true );
}

Assistant:

int Cec_ManSimSimulateRound( Cec_ManSim_t * p, Vec_Ptr_t * vInfoCis, Vec_Ptr_t * vInfoCos )
{
    Gia_Obj_t * pObj;
    unsigned * pRes0, * pRes1, * pRes;
    int i, k, w, Ent, iCiId = 0, iCoId = 0;
    // prepare internal storage
    if ( p->nWordsOld != p->nWords )
        Cec_ManSimMemRelink( p );
    p->nMemsMax = 0;
    // allocate score counters
    ABC_FREE( p->pScores );
    if ( p->pBestState )
        p->pScores = ABC_CALLOC( int, 32 * p->nWords );
    // simulate nodes
    Vec_IntClear( p->vRefinedC );
    if ( Gia_ObjValue(Gia_ManConst0(p->pAig)) )
    {
        pRes = Cec_ManSimSimRef( p, 0 );
        for ( w = 1; w <= p->nWords; w++ )
            pRes[w] = 0;
    }
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) ) 
        {
            if ( Gia_ObjValue(pObj) == 0 )
            {
                iCiId++;
                continue;
            }
            pRes = Cec_ManSimSimRef( p, i );
            if ( vInfoCis ) 
            {
                pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, iCiId++ );
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w-1];
            }
            else
            {
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = Gia_ManRandom( 0 );
            }
            // make sure the first pattern is always zero
            pRes[1] ^= (pRes[1] & 1);
            goto references;
        }
        if ( Gia_ObjIsCo(pObj) ) // co always has non-zero 1st fanin and zero 2nd fanin
        {
            pRes0 = Cec_ManSimSimDeref( p, Gia_ObjFaninId0(pObj,i) );
            if ( vInfoCos )
            {
                pRes = (unsigned *)Vec_PtrEntry( vInfoCos, iCoId++ );
                if ( Gia_ObjFaninC0(pObj) )
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w-1] = ~pRes0[w];
                else 
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w-1] = pRes0[w];
            }
            continue;
        }
        assert( Gia_ObjValue(pObj) );
        pRes  = Cec_ManSimSimRef( p, i );
        pRes0 = Cec_ManSimSimDeref( p, Gia_ObjFaninId0(pObj,i) );
        pRes1 = Cec_ManSimSimDeref( p, Gia_ObjFaninId1(pObj,i) );

//        Abc_Print( 1, "%d,%d  ", Gia_ObjValue( Gia_ObjFanin0(pObj) ), Gia_ObjValue( Gia_ObjFanin1(pObj) ) );

        if ( Gia_ObjFaninC0(pObj) )
        {
            if ( Gia_ObjFaninC1(pObj) )
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = ~(pRes0[w] | pRes1[w]);
            else
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = ~pRes0[w] & pRes1[w];
        }
        else
        {
            if ( Gia_ObjFaninC1(pObj) )
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w] & ~pRes1[w];
            else
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w] & pRes1[w];
        }

references:
        // if this node is candidate constant, collect it
        if ( Gia_ObjIsConst(p->pAig, i) && !Cec_ManSimCompareConst(pRes + 1, p->nWords) )
        {
            pRes[0]++;
            Vec_IntPush( p->vRefinedC, i );
            if ( p->pBestState )
                Cec_ManSimCompareConstScore( pRes + 1, p->nWords, p->pScores );
        }
        // if the node belongs to a class, save it
        if ( Gia_ObjIsClass(p->pAig, i) )
            pRes[0]++;
        // if this is the last node of the class, process it
        if ( Gia_ObjIsTail(p->pAig, i) )
        {
            Vec_IntClear( p->vClassTemp );
            Gia_ClassForEachObj( p->pAig, Gia_ObjRepr(p->pAig, i), Ent )
                Vec_IntPush( p->vClassTemp, Ent );
            Cec_ManSimClassRefineOne( p, Gia_ObjRepr(p->pAig, i) );
            Vec_IntForEachEntry( p->vClassTemp, Ent, k )
                Cec_ManSimSimDeref( p, Ent );
        }
    }

    if ( p->pPars->fConstCorr )
    {
        Vec_IntForEachEntry( p->vRefinedC, i, k )
        {
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
            Cec_ManSimSimDeref( p, i );
        }
        Vec_IntClear( p->vRefinedC );
    }

    if ( Vec_IntSize(p->vRefinedC) > 0 )
        Cec_ManSimProcessRefined( p, p->vRefinedC );
    assert( vInfoCis == NULL || iCiId == Gia_ManCiNum(p->pAig) );
    assert( vInfoCos == NULL || iCoId == Gia_ManCoNum(p->pAig) );
    assert( p->nMems == 1 );
    if ( p->nMems != 1 )
        Abc_Print( 1, "Cec_ManSimSimulateRound(): Memory management error!\n" );
    if ( p->pPars->fVeryVerbose )
        Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
    if ( p->pBestState )
        Cec_ManSimFindBestPattern( p );
/*
    if ( p->nMems > 1 ) {
        for ( i = 1; i < p->nObjs; i++ )
        if ( p->pSims[i] ) {
            int x = 0;
        }
    }
*/
    return Cec_ManSimAnalyzeOutputs( p );
}